

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertialParametersSolidShapesHelpers.cpp
# Opt level: O0

Transform * iDynTree::boxGet6DInertiaInLinkFrameFromDensity(Box *box,double density)

{
  double *pdVar1;
  SpatialInertia *pSVar2;
  Transform *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  MatrixFixSize<3U,_3U> *this;
  double dVar5;
  double dVar6;
  SpatialInertia inertiaInGeometryFrame;
  double z2;
  double y2;
  double x2;
  RotationalInertia rotInertiaInGeomFrame;
  Position comInGeomFrame;
  double boxMass;
  double boxVolume;
  MatrixFixSize<3U,_3U> *in_stack_fffffffffffffed0;
  SpatialInertia local_108 [104];
  double local_a0;
  double local_98;
  double local_90;
  RotationalInertia local_88 [72];
  Position local_40 [24];
  double local_28;
  double local_20;
  double local_18;
  
  local_18 = in_XMM0_Qa;
  dVar3 = (double)iDynTree::Box::getX();
  dVar4 = (double)iDynTree::Box::getY();
  dVar3 = dVar3 * dVar4;
  local_20 = (double)iDynTree::Box::getZ();
  local_20 = dVar3 * local_20;
  local_28 = local_18 * local_20;
  iDynTree::Position::Position(local_40);
  VectorFixSize<3U>::zero((VectorFixSize<3U> *)local_40);
  iDynTree::RotationalInertia::RotationalInertia(local_88);
  MatrixFixSize<3U,_3U>::zero(in_stack_fffffffffffffed0);
  dVar4 = (double)iDynTree::Box::getX();
  local_90 = (double)iDynTree::Box::getX();
  local_90 = dVar4 * local_90;
  this = (MatrixFixSize<3U,_3U> *)iDynTree::Box::getY();
  local_98 = (double)iDynTree::Box::getY();
  local_98 = (double)this * local_98;
  dVar5 = (double)iDynTree::Box::getZ();
  local_a0 = (double)iDynTree::Box::getZ();
  local_a0 = dVar5 * local_a0;
  dVar5 = (local_28 / 12.0) * (local_98 + local_a0);
  pdVar1 = MatrixFixSize<3U,_3U>::operator()(this,(size_t)dVar4,(size_t)dVar3);
  *pdVar1 = dVar5;
  dVar5 = local_28 / 12.0;
  dVar6 = local_90 + local_a0;
  pdVar1 = MatrixFixSize<3U,_3U>::operator()(this,(size_t)dVar4,(size_t)dVar3);
  *pdVar1 = dVar5 * dVar6;
  dVar5 = local_28 / 12.0;
  dVar6 = local_90 + local_98;
  pdVar1 = MatrixFixSize<3U,_3U>::operator()(this,(size_t)dVar4,(size_t)dVar3);
  *pdVar1 = dVar5 * dVar6;
  iDynTree::SpatialInertia::SpatialInertia(local_108,local_28,local_40,local_88);
  pSVar2 = (SpatialInertia *)iDynTree::SolidShape::getLink_H_geometry();
  iDynTree::Transform::operator*(in_RDI,pSVar2);
  return in_RDI;
}

Assistant:

SpatialInertia boxGet6DInertiaInLinkFrameFromDensity(const Box& box,
                                                     double density)
{
    double boxVolume = box.getX() * box.getY() * box.getZ();
    double boxMass   = density*boxVolume;
    // Assuming uniform density, the center of mass is coincident with the box center
    Position comInGeomFrame;
    comInGeomFrame.zero();
    // From http://scienceworld.wolfram.com/physics/MomentofInertiaRectangularParallelepiped.html
    RotationalInertia rotInertiaInGeomFrame;
    rotInertiaInGeomFrame.zero();
    double x2 = box.getX() * box.getX();
    double y2 = box.getY() * box.getY();
    double z2 = box.getZ() * box.getZ();
    rotInertiaInGeomFrame(0, 0) = (boxMass/12.0)*(y2+z2);
    rotInertiaInGeomFrame(1, 1) = (boxMass/12.0)*(x2+z2);
    rotInertiaInGeomFrame(2, 2) = (boxMass/12.0)*(x2+y2);

    SpatialInertia inertiaInGeometryFrame = SpatialInertia(boxMass, comInGeomFrame, rotInertiaInGeomFrame);

    return box.getLink_H_geometry() * inertiaInGeometryFrame;
}